

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

void __thiscall helics::MessageFederate::loadFederateData(MessageFederate *this)

{
  LocalFederateId fedid;
  _func_int *p_Var1;
  Core *coreOb;
  MessageFederateManager *this_00;
  pointer __p;
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  local_30;
  
  p_Var1 = this->_vptr_MessageFederate[-3];
  coreOb = *(Core **)(&this->field_0x18 + (long)p_Var1);
  fedid.fid = *(BaseType *)(&this->field_0x10 + (long)p_Var1);
  this_00 = (MessageFederateManager *)operator_new(0x250);
  MessageFederateManager::MessageFederateManager
            (this_00,coreOb,this,fedid,(bool)(p_Var1 + 6)[(long)&(this->mfManager)._M_t]);
  local_30._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       (tuple<helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
        )(_Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
          )0x0;
  std::
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
           *)&this->mfManager,this_00);
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  ~unique_ptr((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
               *)&local_30);
  if (*(long *)(&this->field_0x40 + (long)this->_vptr_MessageFederate[-3]) != 0) {
    registerMessageInterfaces
              (this,(string *)(&this->field_0x38 + (long)this->_vptr_MessageFederate[-3]));
  }
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}